

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurlquery.cpp
# Opt level: O3

void __thiscall
QUrlQuery::setQueryDelimiters(QUrlQuery *this,QChar valueDelimiter,QChar pairDelimiter)

{
  QSharedDataPointer<QUrlQueryPrivate>::detach(&this->d);
  (((this->d).d.ptr)->valueDelimiter).ucs = valueDelimiter.ucs;
  QSharedDataPointer<QUrlQueryPrivate>::detach(&this->d);
  (((this->d).d.ptr)->pairDelimiter).ucs = pairDelimiter.ucs;
  return;
}

Assistant:

void QUrlQuery::setQueryDelimiters(QChar valueDelimiter, QChar pairDelimiter)
{
    d->valueDelimiter = valueDelimiter;
    d->pairDelimiter = pairDelimiter;
}